

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O1

cbtTriangleInfoMap * __thiscall
cbtCollisionWorldImporter::createTriangleInfoMap(cbtCollisionWorldImporter *this)

{
  int iVar1;
  int iVar2;
  cbtTriangleInfoMap **ptr;
  cbtTriangleInfoMap *this_00;
  cbtTriangleInfoMap **ppcVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  this_00 = (cbtTriangleInfoMap *)::operator_new(0xa0);
  cbtTriangleInfoMap::cbtTriangleInfoMap(this_00);
  iVar1 = (this->m_allocatedTriangleInfoMaps).m_size;
  iVar2 = (this->m_allocatedTriangleInfoMaps).m_capacity;
  if (iVar1 == iVar2) {
    iVar6 = 1;
    if (iVar1 != 0) {
      iVar6 = iVar1 * 2;
    }
    if (iVar2 < iVar6) {
      if (iVar6 == 0) {
        ppcVar3 = (cbtTriangleInfoMap **)0x0;
      }
      else {
        ppcVar3 = (cbtTriangleInfoMap **)cbtAlignedAllocInternal((long)iVar6 << 3,0x10);
      }
      lVar4 = (long)(this->m_allocatedTriangleInfoMaps).m_size;
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          ppcVar3[lVar5] = (this->m_allocatedTriangleInfoMaps).m_data[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      ptr = (this->m_allocatedTriangleInfoMaps).m_data;
      if (ptr != (cbtTriangleInfoMap **)0x0) {
        if ((this->m_allocatedTriangleInfoMaps).m_ownsMemory == true) {
          cbtAlignedFreeInternal(ptr);
        }
        (this->m_allocatedTriangleInfoMaps).m_data = (cbtTriangleInfoMap **)0x0;
      }
      (this->m_allocatedTriangleInfoMaps).m_ownsMemory = true;
      (this->m_allocatedTriangleInfoMaps).m_data = ppcVar3;
      (this->m_allocatedTriangleInfoMaps).m_capacity = iVar6;
    }
  }
  iVar1 = (this->m_allocatedTriangleInfoMaps).m_size;
  (this->m_allocatedTriangleInfoMaps).m_data[iVar1] = this_00;
  (this->m_allocatedTriangleInfoMaps).m_size = iVar1 + 1;
  return this_00;
}

Assistant:

cbtTriangleInfoMap* cbtCollisionWorldImporter::createTriangleInfoMap()
{
	cbtTriangleInfoMap* tim = new cbtTriangleInfoMap();
	m_allocatedTriangleInfoMaps.push_back(tim);
	return tim;
}